

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack22_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar3 = *(ulong *)in;
  auVar10._8_4_ = 0x3fffff;
  auVar10._0_8_ = 0x3fffff003fffff;
  auVar10._12_4_ = 0x3fffff;
  uVar1 = in[5];
  *out = (uint)uVar3 & 0x3fffff;
  uVar4 = *(ulong *)(in + 2);
  auVar5 = vpinsrd_avx(auVar10,((uint)(uVar3 >> 0x20) & 0xfff) << 10,0);
  uVar2 = in[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar8 = vpsllvd_avx2(auVar9,_DAT_001a3980);
  auVar6._8_8_ = 0x3fff0000300000;
  auVar6._0_8_ = 0x3fff0000300000;
  auVar7 = vpandq_avx512vl(auVar8,auVar6);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar8 = vshufps_avx(auVar8,auVar9,4);
  auVar6 = vpsrlvd_avx2(auVar8,_DAT_001a39a0);
  auVar5 = vpunpckldq_avx(auVar5,auVar7);
  auVar8 = vpor_avx(auVar6,auVar5);
  auVar5 = vpand_avx(auVar6,auVar10);
  auVar5 = vpblendd_avx2(auVar8,auVar5,4);
  *(undefined1 (*) [16])(out + 1) = auVar5;
  out[5] = (uint)(uVar4 >> 0x2e) | (uVar2 & 0xf) << 0x12;
  out[6] = uVar2 >> 4 & 0x3fffff;
  out[7] = (uVar1 & 0xffff) << 6 | uVar2 >> 0x1a;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack22_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;

  return in + 1;
}